

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall bidirectional::Search::Search(Search *this,Directions *direction_in)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = *in_RSI;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 5) = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  std::make_unique<std::vector<double,std::allocator<double>>>();
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2cec5e);
  std::shared_ptr<labelling::Label>::shared_ptr((shared_ptr<labelling::Label> *)0x2cec71);
  std::shared_ptr<labelling::Label>::shared_ptr((shared_ptr<labelling::Label> *)0x2cec84);
  std::
  vector<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
  ::vector((vector<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
            *)0x2cec97);
  std::
  vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>::
  vector((vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
          *)0x2cecad);
  std::make_unique<std::vector<labelling::Label,std::allocator<labelling::Label>>>();
  return;
}

Assistant:

Search::Search(const Directions& direction_in)
    : direction(direction_in),
      lower_bound_weight(std::make_unique<std::vector<double>>()),
      unprocessed_labels(std::make_unique<std::vector<labelling::Label>>()){}